

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O1

void swap_data(bam1_core_t *c,int l_data,uint8_t *data,int is_host)

{
  ushort *puVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong *puVar8;
  ulong *puVar9;
  uint uVar10;
  uint uVar11;
  
  uVar4 = *(ulong *)&c->field_0x8 >> 0x18 & 0xff;
  uVar6 = *(ulong *)&c->field_0x8 >> 0x30;
  iVar3 = c->l_qseq;
  if (uVar6 != 0) {
    uVar7 = 0;
    do {
      uVar10 = *(uint *)(data + uVar7 * 4 + uVar4);
      *(uint *)(data + uVar7 * 4 + uVar4) =
           uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
      uVar7 = uVar7 + 1;
    } while (uVar7 < *(ushort *)&c->field_0xe);
  }
  puVar9 = (ulong *)(data + (long)((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1) +
                            (long)iVar3 + uVar6 * 4 + uVar4);
  do {
    if (data + l_data <= puVar9) {
      return;
    }
    bVar2 = *(byte *)((long)puVar9 + 2);
    bVar5 = 1;
    if (bVar2 < 0x5a) {
      switch(bVar2) {
      case 0x41:
      case 0x43:
        break;
      case 0x42:
      case 0x48:
        bVar5 = bVar2;
        break;
      case 0x44:
      case 0x45:
      case 0x46:
      case 0x47:
switchD_0013c081_caseD_44:
        bVar5 = 0;
        break;
      case 0x49:
switchD_0013c081_caseD_49:
        bVar5 = 4;
        break;
      default:
        if (bVar2 != 0x53) goto switchD_0013c081_caseD_44;
LAB_0013c0ae:
        bVar5 = 2;
      }
    }
    else {
      switch(bVar2) {
      case 99:
        break;
      case 100:
        bVar5 = 8;
        break;
      case 0x65:
      case 0x67:
      case 0x68:
        goto switchD_0013c081_caseD_44;
      case 0x66:
      case 0x69:
        goto switchD_0013c081_caseD_49;
      default:
        bVar5 = bVar2;
        if (bVar2 != 0x5a) {
          if (bVar2 == 0x73) goto LAB_0013c0ae;
          goto switchD_0013c081_caseD_44;
        }
      }
    }
    puVar8 = (ulong *)((long)puVar9 + 3);
    if (bVar5 < 0x42) {
      switch(bVar5) {
      case 1:
        puVar8 = (ulong *)((long)puVar9 + 4);
        break;
      case 2:
        puVar1 = (ushort *)((long)puVar9 + 3);
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
        puVar8 = (ulong *)((long)puVar9 + 5);
        break;
      default:
        goto switchD_0013c0e2_caseD_3;
      case 4:
        uVar10 = *(uint *)((long)puVar9 + 3);
        *(uint *)((long)puVar9 + 3) =
             uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
        puVar8 = (ulong *)((long)puVar9 + 7);
        break;
      case 8:
        uVar4 = *(ulong *)((long)puVar9 + 3);
        *(ulong *)((long)puVar9 + 3) =
             uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
             (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
             (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
        puVar8 = (ulong *)((long)puVar9 + 0xb);
      }
      goto switchD_0013c1e7_caseD_3;
    }
    if (bVar5 == 0x42) {
      bVar2 = *(byte *)puVar8;
      bVar5 = 1;
      if (bVar2 < 0x5a) {
        switch(bVar2) {
        case 0x41:
        case 0x43:
          break;
        case 0x42:
        case 0x48:
          bVar5 = bVar2;
          break;
        case 0x44:
        case 0x45:
        case 0x46:
        case 0x47:
switchD_0013c152_caseD_44:
          bVar5 = 0;
          break;
        case 0x49:
switchD_0013c152_caseD_49:
          bVar5 = 4;
          break;
        default:
          if (bVar2 != 0x53) goto switchD_0013c152_caseD_44;
LAB_0013c1a0:
          bVar5 = 2;
        }
      }
      else {
        switch(bVar2) {
        case 99:
          break;
        case 100:
          bVar5 = 8;
          break;
        case 0x65:
        case 0x67:
        case 0x68:
          goto switchD_0013c152_caseD_44;
        case 0x66:
        case 0x69:
          goto switchD_0013c152_caseD_49;
        default:
          bVar5 = bVar2;
          if (bVar2 != 0x5a) {
            if (bVar2 == 0x73) goto LAB_0013c1a0;
            goto switchD_0013c152_caseD_44;
          }
        }
      }
      if (is_host == 0) {
        uVar10 = *(uint *)((long)puVar9 + 4);
        uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18
        ;
        uVar11 = uVar10;
      }
      else {
        uVar10 = *(uint *)((long)puVar9 + 4);
        uVar11 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18
        ;
      }
      *(uint *)((long)puVar9 + 4) = uVar11;
      puVar8 = puVar9 + 1;
      switch(bVar5) {
      case 1:
        puVar8 = (ulong *)((long)puVar8 + (ulong)uVar10);
      default:
switchD_0013c1e7_caseD_3:
        break;
      case 2:
        for (; uVar10 != 0; uVar10 = uVar10 - 1) {
          *(ushort *)puVar8 = (ushort)*puVar8 << 8 | (ushort)*puVar8 >> 8;
          puVar8 = (ulong *)((long)puVar8 + 2);
        }
        break;
      case 4:
        for (; uVar10 != 0; uVar10 = uVar10 - 1) {
          uVar11 = (uint)*puVar8;
          *(uint *)puVar8 =
               uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
          puVar8 = (ulong *)((long)puVar8 + 4);
        }
        break;
      case 8:
        for (; uVar10 != 0; uVar10 = uVar10 - 1) {
          uVar4 = *puVar8;
          *puVar8 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                    (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                    (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
                    (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
          puVar8 = puVar8 + 1;
        }
      }
    }
    else {
      puVar9 = puVar8;
      if ((bVar5 == 0x5a) || (bVar5 == 0x48)) {
        do {
          puVar8 = (ulong *)((long)puVar9 + 1);
          uVar4 = *puVar9;
          puVar9 = puVar8;
        } while ((byte)uVar4 != 0);
      }
    }
switchD_0013c0e2_caseD_3:
    puVar9 = puVar8;
  } while( true );
}

Assistant:

static void swap_data(const bam1_core_t *c, int l_data, uint8_t *data, int is_host)
{
    uint8_t *s;
    uint32_t *cigar = (uint32_t*)(data + c->l_qname);
    uint32_t i, n;
    s = data + c->n_cigar*4 + c->l_qname + c->l_qseq + (c->l_qseq + 1)/2;
    for (i = 0; i < c->n_cigar; ++i) ed_swap_4p(&cigar[i]);
    while (s < data + l_data) {
        int size;
        s += 2; // skip key
        size = aux_type2size(*s); ++s; // skip type
        switch (size) {
        case 1: ++s; break;
        case 2: ed_swap_2p(s); s += 2; break;
        case 4: ed_swap_4p(s); s += 4; break;
        case 8: ed_swap_8p(s); s += 8; break;
        case 'Z':
        case 'H':
            while (*s) ++s;
            ++s;
            break;
        case 'B':
            size = aux_type2size(*s); ++s;
            if (is_host) memcpy(&n, s, 4), ed_swap_4p(s);
            else ed_swap_4p(s), memcpy(&n, s, 4);
            s += 4;
            switch (size) {
            case 1: s += n; break;
            case 2: for (i = 0; i < n; ++i, s += 2) ed_swap_2p(s); break;
            case 4: for (i = 0; i < n; ++i, s += 4) ed_swap_4p(s); break;
            case 8: for (i = 0; i < n; ++i, s += 8) ed_swap_8p(s); break;
            }
            break;
        }
    }
}